

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_large_file.cc
# Opt level: O0

void __thiscall ImageChecker::~ImageChecker(ImageChecker *this)

{
  ImageChecker *this_local;
  
  ~ImageChecker(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~ImageChecker() override = default;